

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void google::protobuf::internal::SwapFieldHelper::SwapRepeatedMessageField<true>
               (Reflection *r,Message *lhs,Message *rhs,FieldDescriptor *field)

{
  bool bVar1;
  MapFieldBase *this;
  MapFieldBase *other;
  RepeatedPtrFieldBase *this_00;
  RepeatedPtrFieldBase *rhs_00;
  RepeatedPtrFieldBase *rhs_rm;
  RepeatedPtrFieldBase *lhs_rm;
  MapFieldBase *rhs_map;
  MapFieldBase *lhs_map;
  FieldDescriptor *field_local;
  Message *rhs_local;
  Message *lhs_local;
  Reflection *r_local;
  
  bVar1 = anon_unknown_6::IsMapFieldInApi(field);
  if (bVar1) {
    this = Reflection::MutableRaw<google::protobuf::internal::MapFieldBase>(r,lhs,field);
    other = Reflection::MutableRaw<google::protobuf::internal::MapFieldBase>(r,rhs,field);
    MapFieldBase::InternalSwap(this,other);
  }
  else {
    this_00 = Reflection::MutableRaw<google::protobuf::internal::RepeatedPtrFieldBase>(r,lhs,field);
    rhs_00 = Reflection::MutableRaw<google::protobuf::internal::RepeatedPtrFieldBase>(r,rhs,field);
    RepeatedPtrFieldBase::InternalSwap(this_00,rhs_00);
  }
  return;
}

Assistant:

void SwapFieldHelper::SwapRepeatedMessageField(const Reflection* r,
                                               Message* lhs, Message* rhs,
                                               const FieldDescriptor* field) {
  if (IsMapFieldInApi(field)) {
    auto* lhs_map = r->MutableRaw<MapFieldBase>(lhs, field);
    auto* rhs_map = r->MutableRaw<MapFieldBase>(rhs, field);
    if (unsafe_shallow_swap) {
      lhs_map->InternalSwap(rhs_map);
    } else {
      lhs_map->Swap(rhs_map);
    }
  } else {
    auto* lhs_rm = r->MutableRaw<RepeatedPtrFieldBase>(lhs, field);
    auto* rhs_rm = r->MutableRaw<RepeatedPtrFieldBase>(rhs, field);
    if (unsafe_shallow_swap) {
      lhs_rm->InternalSwap(rhs_rm);
    } else {
      lhs_rm->Swap<GenericTypeHandler<Message>>(rhs_rm);
    }
  }
}